

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestCoverageHandler::ShouldIDoCoverage
          (cmCTestCoverageHandler *this,string *file,string *srcDir,string *binDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmCTest *pcVar4;
  cmCTestCoverageHandler *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  size_type *psVar11;
  pointer pRVar12;
  pointer this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string fFile;
  string fSrcDir;
  string relPath;
  string checkDir;
  string ndc;
  string fileDir;
  string fBinDir;
  ostringstream cmCTestLog_msg;
  string local_2c8;
  string local_2a8;
  string local_288;
  cmCTestCoverageHandler *local_268;
  char *local_260;
  undefined8 local_258;
  char local_250;
  undefined7 uStack_24f;
  string local_240;
  string local_220;
  string *local_200;
  string *local_1f8;
  pointer local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar6 = IsFilteredOut(this,file);
  if (bVar6) {
LAB_00556b76:
    bVar6 = false;
  }
  else {
    this_00 = (this->CustomCoverageExcludeRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar12 = (this->CustomCoverageExcludeRegex).
              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    bVar6 = this_00 == pRVar12;
    local_268 = this;
    local_200 = srcDir;
    local_1f8 = binDir;
    if (!bVar6) {
      local_1f0 = pRVar12;
      do {
        bVar7 = cmsys::RegularExpression::find(this_00,(file->_M_dataplus)._M_p,&this_00->regmatch);
        if (bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  File ",7);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(file->_M_dataplus)._M_p,file->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," is excluded in CTestCustom.ctest",0x21);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar5 = local_268;
          pcVar4 = (local_268->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0xcd,local_288._M_dataplus._M_p,(pcVar5->super_cmCTestGenericHandler).Quiet)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          pRVar12 = local_1f0;
          if (bVar7) {
            if (!bVar6) goto LAB_00556b76;
            break;
          }
        }
        this_00 = this_00 + 1;
        bVar6 = this_00 == pRVar12;
      } while (!bVar6);
    }
    cmsys::SystemTools::CollapseFullPath(&local_288,local_200);
    cmsys::SystemTools::CollapseFullPath(&local_1c8,local_1f8);
    cmsys::SystemTools::CollapseFullPath(&local_2a8,file);
    bVar6 = cmsys::SystemTools::IsSubDirectory(&local_2a8,&local_288);
    bVar7 = cmsys::SystemTools::IsSubDirectory(&local_2a8,&local_1c8);
    cmsys::SystemTools::GetFilenamePath(&local_1e8,&local_2a8);
    paVar2 = &local_240.field_2;
    local_240._M_string_length = 0;
    local_240.field_2._M_local_buf[0] = '\0';
    local_240._M_dataplus._M_p = (pointer)paVar2;
    if ((bVar6 && bVar7) || (bVar7 || bVar6)) {
      std::__cxx11::string::_M_assign((string *)&local_240);
    }
    pcVar3 = local_1a8 + 0x10;
    local_1a8._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,".NoDartCoverage","");
    cmSystemTools::FileExistsInParentDirectories
              (&local_220,(string *)local_1a8,&local_2a8,&local_240);
    if ((pointer)local_1a8._0_8_ != pcVar3) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_220._M_string_length == 0) {
      local_258 = 0;
      local_250 = '\0';
      local_260 = &local_250;
      if (local_240._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_260);
      }
      else {
        cmSystemTools::RelativePath((string *)local_1a8,&local_240,&local_2a8);
        std::__cxx11::string::operator=((string *)&local_260,(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar3) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      if ((local_240._M_string_length == local_288._M_string_length) &&
         (local_240._M_string_length != 0)) {
        bcmp(local_240._M_dataplus._M_p,local_288._M_dataplus._M_p,local_240._M_string_length);
      }
      std::__cxx11::string::_M_assign((string *)&local_240);
      paVar1 = &local_2c8.field_2;
      local_2c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c8,local_240._M_dataplus._M_p,
                 local_240._M_dataplus._M_p + local_240._M_string_length);
      std::__cxx11::string::append((char *)&local_2c8);
      plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_260);
      psVar11 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar11) {
        local_1a8._16_8_ = *psVar11;
        local_1a8._24_8_ = plVar10[3];
        local_1a8._0_8_ = pcVar3;
      }
      else {
        local_1a8._16_8_ = *psVar11;
        local_1a8._0_8_ = (size_type *)*plVar10;
      }
      local_1a8._8_8_ = plVar10[1];
      *plVar10 = (long)psVar11;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar3) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenamePath((string *)local_1a8,&local_2a8);
      std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar3) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((local_1e8._M_string_length != local_2a8._M_string_length) ||
         ((bVar6 = true, local_1e8._M_string_length != 0 &&
          (iVar8 = bcmp(local_1e8._M_dataplus._M_p,local_2a8._M_dataplus._M_p,
                        local_1e8._M_string_length), iVar8 != 0)))) {
        local_2c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,".NoDartCoverage","");
        cmSystemTools::FileExistsInParentDirectories
                  ((string *)local_1a8,&local_2c8,&local_2a8,&local_240);
        std::__cxx11::string::operator=((string *)&local_220,(string *)local_1a8);
        if ((pointer)local_1a8._0_8_ != pcVar3) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if (local_220._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found: ",7);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                              local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," so skip coverage of: ",0x16);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(file->_M_dataplus)._M_p,file->_M_string_length);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          pcVar5 = local_268;
          pcVar4 = (local_268->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar4,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                       ,0x10d,local_2c8._M_dataplus._M_p,(pcVar5->super_cmCTestGenericHandler).Quiet
                      );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != paVar1) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          bVar6 = false;
        }
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found: ",7);
      pcVar5 = local_268;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," so skip coverage of ",0x15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(file->_M_dataplus)._M_p,file->_M_string_length);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar4 = (pcVar5->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0xed,local_260,(pcVar5->super_cmCTestGenericHandler).Quiet);
      if (local_260 != &local_250) {
        operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,
                      CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                               local_240.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar6;
}

Assistant:

bool cmCTestCoverageHandler::ShouldIDoCoverage(std::string const& file,
                                               std::string const& srcDir,
                                               std::string const& binDir)
{
  if (this->IsFilteredOut(file)) {
    return false;
  }

  for (cmsys::RegularExpression& rx : this->CustomCoverageExcludeRegex) {
    if (rx.find(file)) {
      cmCTestOptionalLog(
        this->CTest, HANDLER_VERBOSE_OUTPUT,
        "  File " << file << " is excluded in CTestCustom.ctest" << std::endl;
        , this->Quiet);
      return false;
    }
  }

  std::string fSrcDir = cmSystemTools::CollapseFullPath(srcDir);
  std::string fBinDir = cmSystemTools::CollapseFullPath(binDir);
  std::string fFile = cmSystemTools::CollapseFullPath(file);
  bool sourceSubDir = cmSystemTools::IsSubDirectory(fFile, fSrcDir);
  bool buildSubDir = cmSystemTools::IsSubDirectory(fFile, fBinDir);
  // Always check parent directory of the file.
  std::string fileDir = cmSystemTools::GetFilenamePath(fFile);
  std::string checkDir;

  // We also need to check the binary/source directory pair.
  if (sourceSubDir && buildSubDir) {
    if (fSrcDir.size() > fBinDir.size()) {
      checkDir = fSrcDir;
    } else {
      checkDir = fBinDir;
    }
  } else if (sourceSubDir) {
    checkDir = fSrcDir;
  } else if (buildSubDir) {
    checkDir = fBinDir;
  }
  std::string ndc = cmSystemTools::FileExistsInParentDirectories(
    ".NoDartCoverage", fFile, checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }

  // By now checkDir should be set to parent directory of the file.
  // Get the relative path to the file an apply it to the opposite directory.
  // If it is the same as fileDir, then ignore, otherwise check.
  std::string relPath;
  if (!checkDir.empty()) {
    relPath = cmSystemTools::RelativePath(checkDir, fFile);
  } else {
    relPath = fFile;
  }
  if (checkDir == fSrcDir) {
    checkDir = fBinDir;
  } else {
    checkDir = fSrcDir;
  }
  fFile = checkDir + "/" + relPath;
  fFile = cmSystemTools::GetFilenamePath(fFile);

  if (fileDir == fFile) {
    // This is in-source build, so we trust the previous check.
    return true;
  }

  ndc = cmSystemTools::FileExistsInParentDirectories(".NoDartCoverage", fFile,
                                                     checkDir);
  if (!ndc.empty()) {
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Found: " << ndc << " so skip coverage of: " << file
                                 << std::endl,
                       this->Quiet);
    return false;
  }
  // Ok, nothing in source tree, nothing in binary tree
  return true;
}